

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DwaCompressor::LossyDctEncoderBase::LossyDctEncoderBase
          (LossyDctEncoderBase *this,float quantBaseError,char *packedAc,char *packedDc,
          unsigned_short *toNonlinear,int width,int height)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_XMM0_Da;
  int idx;
  int jpegQuantTableCbCrMin;
  int jpegQuantTableCbCr [64];
  int jpegQuantTableYMin;
  int jpegQuantTableY [64];
  int local_250;
  int local_248 [67];
  int local_13c;
  int local_138 [70];
  undefined8 local_20;
  undefined8 local_18;
  
  *in_RDI = &PTR__LossyDctEncoderBase_0374b798;
  *(undefined4 *)(in_RDI + 1) = in_XMM0_Da;
  *(undefined4 *)((long)in_RDI + 0xc) = in_R8D;
  *(undefined4 *)(in_RDI + 2) = in_R9D;
  in_RDI[3] = in_RCX;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::vector((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            *)0xa6046f);
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::vector
            ((vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_> *)0xa6047c);
  std::
  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ::vector((vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
            *)0xa60489);
  in_RDI[0xe] = local_18;
  in_RDI[0xf] = local_20;
  memcpy(local_138,&DAT_03466dc0,0x100);
  local_13c = 10;
  memcpy(local_248,&DAT_03466ec0,0x100);
  for (local_250 = 0; local_250 < 0x40; local_250 = local_250 + 1) {
    *(float *)((long)in_RDI + (long)local_250 * 4 + 0x80) =
         (float)local_138[local_250] / (float)local_13c;
    *(float *)((long)in_RDI + (long)local_250 * 4 + 0x180) = (float)local_248[local_250] / 17.0;
  }
  return;
}

Assistant:

DwaCompressor::LossyDctEncoderBase::LossyDctEncoderBase
    (float quantBaseError,
     char *packedAc,
     char *packedDc,
     const unsigned short *toNonlinear,
     int width,
     int height)
:
    _quantBaseError(quantBaseError),
    _width(width),
    _height(height),
    _toNonlinear(toNonlinear),
    _numAcComp(0),
    _numDcComp(0),
    _packedAc(packedAc),
    _packedDc(packedDc)
{
    //
    // Here, we take the generic JPEG quantization tables and
    // normalize them by the smallest component in each table.
    // This gives us a relationship amongst the DCT components,
    // in terms of how sensitive each component is to
    // error.
    //
    // A higher normalized value means we can quantize more,
    // and a small normalized value means we can quantize less.
    //
    // Eventually, we will want an acceptable quantization
    // error range for each component. We find this by
    // multiplying some user-specified level (_quantBaseError)
    // by the normalized table (_quantTableY, _quantTableCbCr) to
    // find the acceptable quantization error range.
    //
    // The quantization table is not needed for decoding, and
    // is not transmitted. So, if you want to get really fancy,
    // you could derive some content-dependent quantization
    // table, and the decoder would not need to be changed. But,
    // for now, we'll just use statice quantization tables.
    //

    int jpegQuantTableY[] =
    {
        16,  11,  10,  16,   24,   40,   51,   61,
        12,  12,  14,  19,   26,   58,   60,   55,
        14,  13,  16,  24,   40,   57,   69,   56,
        14,  17,  22,  29,   51,   87,   80,   62,
        18,  22,  37,  56,   68,  109,  103,   77,
        24,  35,  55,  64,   81,  104,  113,   92,
        49,  64,  78,  87,  103,  121,  120,  101,
        72,  92,  95,  98,  112,  100,  103,   99
    };

    int jpegQuantTableYMin = 10;

    int jpegQuantTableCbCr[] =
    {
        17,  18,  24,  47,  99,  99,  99,  99,
        18,  21,  26,  66,  99,  99,  99,  99,
        24,  26,  56,  99,  99,  99,  99,  99,
        47,  66,  99,  99,  99,  99,  99,  99,
        99,  99,  99,  99,  99,  99,  99,  99,
        99,  99,  99,  99,  99,  99,  99,  99,
        99,  99,  99,  99,  99,  99,  99,  99,
        99,  99,  99,  99,  99,  99,  99,  99
    };

    int jpegQuantTableCbCrMin = 17;

    for (int idx = 0; idx < 64; ++idx)
    {
        _quantTableY[idx] = static_cast<float> (jpegQuantTableY[idx]) /
                            static_cast<float> (jpegQuantTableYMin);

        _quantTableCbCr[idx] = static_cast<float> (jpegQuantTableCbCr[idx]) /
                               static_cast<float> (jpegQuantTableCbCrMin);
    }
    
    if (_quantBaseError < 0)
        quantBaseError = 0;
}